

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall PhPacker_Arg_d_Test::TestBody(PhPacker_Arg_d_Test *this)

{
  bool bVar1;
  char *pcVar2;
  double dVar3;
  AssertHelper local_d8;
  Message local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  string local_a8;
  uint local_84;
  AssertHelper local_80;
  Message local_78;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  double expected;
  any local_48;
  double local_38;
  double result;
  string str;
  PhPacker_Arg_d_Test *this_local;
  
  str.field_2._8_8_ = this;
  PhPacker::pack<double,_0>((string *)&result,'d',1.234);
  PhPacker::unpack((PhPacker *)&local_48,'d',(string *)&result);
  dVar3 = std::any_cast<double>(&local_48);
  std::any::~any(&local_48);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x3ff3be76c8b43958;
  local_38 = dVar3;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_70,"result","expected",&local_38,(double *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
               ,0x170,pcVar2);
    testing::internal::AssertHelper::operator=(&local_80,&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    testing::Message::~Message(&local_78);
  }
  local_84 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  if (local_84 == 0) {
    PhPacker::pack<double,_0>(&local_a8,'d',65232.123);
    std::__cxx11::string::operator=((string *)&result,(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    PhPacker::unpack((PhPacker *)&gtest_ar_1.message_,'d',(string *)&result);
    local_38 = std::any_cast<double>((any *)&gtest_ar_1.message_);
    std::any::~any((any *)&gtest_ar_1.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x40efda03ef9db22d;
    testing::internal::EqHelper::Compare<double,_double,_nullptr>
              ((EqHelper *)local_c8,"result","expected",&local_38,(double *)&gtest_ar.message_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Waqar144[P]phpack/tests/test.cpp"
                 ,0x175,pcVar2);
      testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
      testing::internal::AssertHelper::~AssertHelper(&local_d8);
      testing::Message::~Message(&local_d0);
    }
    local_84 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    if (local_84 == 0) {
      local_84 = 0;
    }
  }
  std::__cxx11::string::~string((string *)&result);
  return;
}

Assistant:

TEST(PhPacker, Arg_d)
{
   std::string str = PhPacker::pack<double>('d', 1.234);
   double result = std::any_cast<double>(PhPacker::unpack('d', str));
   double expected = 1.234;
   GTEST_ASSERT_EQ(result, expected);

   str = PhPacker::pack<double>('d', 65232.123);
   result = std::any_cast<double>(PhPacker::unpack('d', str));
   expected = 65232.123;
   GTEST_ASSERT_EQ(result, expected);
}